

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iface.c
# Opt level: O1

int nn_iface_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                    size_t *resultlen)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  
  if ((addrlen == 1) && (*addr == '*')) {
    if (ipv4only == 0) {
      if (result != (sockaddr_storage *)0x0) {
        result->ss_family = 10;
        uVar1 = _poll;
        *(undefined8 *)(result->__ss_padding + 6) = _in6addr_any;
        *(undefined8 *)(result->__ss_padding + 0xe) = uVar1;
      }
      iVar3 = 0;
      if (resultlen != (size_t *)0x0) {
        *resultlen = 0x1c;
      }
    }
    else {
      if (result != (sockaddr_storage *)0x0) {
        result->ss_family = 2;
        result->__ss_padding[2] = '\0';
        result->__ss_padding[3] = '\0';
        result->__ss_padding[4] = '\0';
        result->__ss_padding[5] = '\0';
      }
      iVar3 = 0;
      if (resultlen != (size_t *)0x0) {
        *resultlen = 0x10;
        iVar3 = 0;
      }
    }
  }
  else {
    iVar2 = nn_literal_resolve(addr,addrlen,ipv4only,result,resultlen);
    iVar3 = -0x13;
    if (iVar2 != -0x16) {
      if (iVar2 != 0) {
        nn_iface_resolve_cold_1();
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int nn_iface_resolve (const char *addr, size_t addrlen, int ipv4only,
    struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;

    /*  Asterisk is a special name meaning "all interfaces". */
    if (addrlen == 1 && addr [0] == '*') {
        nn_iface_any (ipv4only, result, resultlen);
        return 0;
    }

    rc = nn_literal_resolve (addr, addrlen, ipv4only, result, resultlen);
    if (rc == -EINVAL)
        return -ENODEV;
    errnum_assert (rc == 0, -rc);
    return 0;
}